

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O2

bool helics::fileops::looksLikeCommandLine(string_view testString)

{
  char cVar1;
  size_type sVar2;
  char *in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if ((in_RDI != 0) && (cVar1 = *in_RSI, cVar1 != '#')) {
    if (cVar1 == '-') {
      return true;
    }
    if ((cVar1 != '\\') && (cVar1 != '{')) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_10," -",0);
      return sVar2 != 0xffffffffffffffff;
    }
  }
  return false;
}

Assistant:

bool looksLikeCommandLine(std::string_view testString)
{
    if (testString.empty()) {
        return false;
    }
    if (testString.front() == '-') {
        return true;
    }
    if (testString.front() == '\\' || testString.front() == '#' || testString.front() == '{') {
        return false;
    }
    return testString.find(" -") != std::string_view::npos;
}